

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void generic_mixed_endian(void)

{
  int iVar1;
  greatest_test_res local_28;
  greatest_test_res local_24;
  greatest_test_res res_7;
  greatest_test_res res_6;
  greatest_test_res res_5;
  greatest_test_res res_4;
  greatest_test_res res_3;
  greatest_test_res res_2;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_pre_test("generic_mixed_endian_u16_should_not_match");
  if (iVar1 == 1) {
    res_2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_2 == GREATEST_TEST_RES_PASS) {
      res_2 = generic_mixed_endian_u16_should_not_match();
    }
    greatest_post_test("generic_mixed_endian_u16_should_not_match",res_2);
  }
  else if ((greatest_info.flags & 2) != 0) {
    fprintf(_stdout,"  %s\n","generic_mixed_endian_u16_should_not_match");
  }
  iVar1 = greatest_pre_test("generic_mixed_endian_i16_should_not_match");
  if (iVar1 == 1) {
    res_3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_3 == GREATEST_TEST_RES_PASS) {
      res_3 = generic_mixed_endian_i16_should_not_match();
    }
    greatest_post_test("generic_mixed_endian_i16_should_not_match",res_3);
  }
  else if ((greatest_info.flags & 2) != 0) {
    fprintf(_stdout,"  %s\n","generic_mixed_endian_i16_should_not_match");
  }
  iVar1 = greatest_pre_test("generic_mixed_endian_u32_should_not_match");
  if (iVar1 == 1) {
    res_4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_4 == GREATEST_TEST_RES_PASS) {
      res_4 = generic_mixed_endian_u32_should_not_match();
    }
    greatest_post_test("generic_mixed_endian_u32_should_not_match",res_4);
  }
  else if ((greatest_info.flags & 2) != 0) {
    fprintf(_stdout,"  %s\n","generic_mixed_endian_u32_should_not_match");
  }
  iVar1 = greatest_pre_test("generic_mixed_endian_i32_should_not_match");
  if (iVar1 == 1) {
    res_5 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_5 == GREATEST_TEST_RES_PASS) {
      res_5 = generic_mixed_endian_i32_should_not_match();
    }
    greatest_post_test("generic_mixed_endian_i32_should_not_match",res_5);
  }
  else if ((greatest_info.flags & 2) != 0) {
    fprintf(_stdout,"  %s\n","generic_mixed_endian_i32_should_not_match");
  }
  iVar1 = greatest_pre_test("generic_mixed_endian_u64_should_not_match");
  if (iVar1 == 1) {
    res_6 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_6 == GREATEST_TEST_RES_PASS) {
      res_6 = generic_mixed_endian_u64_should_not_match();
    }
    greatest_post_test("generic_mixed_endian_u64_should_not_match",res_6);
  }
  else if ((greatest_info.flags & 2) != 0) {
    fprintf(_stdout,"  %s\n","generic_mixed_endian_u64_should_not_match");
  }
  iVar1 = greatest_pre_test("generic_mixed_endian_i64_should_not_match");
  if (iVar1 == 1) {
    res_7 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_7 == GREATEST_TEST_RES_PASS) {
      res_7 = generic_mixed_endian_i64_should_not_match();
    }
    greatest_post_test("generic_mixed_endian_i64_should_not_match",res_7);
  }
  else if ((greatest_info.flags & 2) != 0) {
    fprintf(_stdout,"  %s\n","generic_mixed_endian_i64_should_not_match");
  }
  iVar1 = greatest_pre_test("generic_mixed_endian_f_should_not_match");
  if (iVar1 == 1) {
    local_24 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_24 == GREATEST_TEST_RES_PASS) {
      local_24 = generic_mixed_endian_f_should_not_match();
    }
    greatest_post_test("generic_mixed_endian_f_should_not_match",local_24);
  }
  else if ((greatest_info.flags & 2) != 0) {
    fprintf(_stdout,"  %s\n","generic_mixed_endian_f_should_not_match");
  }
  iVar1 = greatest_pre_test("generic_mixed_endian_d_should_not_match");
  if (iVar1 == 1) {
    local_28 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_28 == GREATEST_TEST_RES_PASS) {
      local_28 = generic_mixed_endian_d_should_not_match();
    }
    greatest_post_test("generic_mixed_endian_d_should_not_match",local_28);
  }
  else if ((greatest_info.flags & 2) != 0) {
    fprintf(_stdout,"  %s\n","generic_mixed_endian_d_should_not_match");
  }
  return;
}

Assistant:

SUITE(generic_mixed_endian) {
    RUN_TEST(generic_mixed_endian_u16_should_not_match);
    RUN_TEST(generic_mixed_endian_i16_should_not_match);
    RUN_TEST(generic_mixed_endian_u32_should_not_match);
    RUN_TEST(generic_mixed_endian_i32_should_not_match);
    RUN_TEST(generic_mixed_endian_u64_should_not_match);
    RUN_TEST(generic_mixed_endian_i64_should_not_match);
    RUN_TEST(generic_mixed_endian_f_should_not_match);
    RUN_TEST(generic_mixed_endian_d_should_not_match);
}